

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * __thiscall
FSerializer::Args(FSerializer *this,char *key,int *args,int *defargs,int special)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  FWriter *pFVar4;
  int iVar5;
  Value *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  Ch *cc;
  char *text;
  ulong uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pFVar4 = this->w;
  if (pFVar4 == (FWriter *)0x0) {
    this_00 = FReader::FindKey(this->r,key);
    if (this_00 != (Value *)0x0) {
      if ((this_00->data_).f.flags != 4) {
        __assert_fail("false && \"array expected\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x2f5,"FSerializer &FSerializer::Args(const char *, int *, int *, int)");
      }
      uVar2 = (this_00->data_).s.length;
      if (uVar2 != 0) {
        uVar6 = 5;
        if (uVar2 < 5) {
          uVar6 = (ulong)uVar2;
        }
        uVar8 = 0;
        do {
          this_01 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::operator[](this_00,(SizeType)uVar8);
          uVar1 = (this_01->data_).f.flags;
          if ((uVar1 & 0x20) == 0) {
            if ((uVar8 != 0) || ((uVar1 & 0x400) == 0)) {
              __assert_fail("false && \"Integer expected\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                            ,0x2ed,"FSerializer &FSerializer::Args(const char *, int *, int *, int)"
                           );
            }
            cc = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_01);
            text = UnicodeToString(cc);
            iVar5 = FName::NameManager::FindName(&FName::NameData,text,false);
            *args = -iVar5;
          }
          else {
            args[uVar8] = (this_01->data_).s.length;
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
    }
  }
  else {
    uVar2 = (pFVar4->mInObject).Count;
    if (((uVar2 != 0) && (defargs != (int *)0x0)) && ((pFVar4->mInObject).Array[uVar2 - 1] != false)
       ) {
      auVar9[0] = -((char)*defargs == (char)*args);
      auVar9[1] = -(*(char *)((long)defargs + 1) == *(char *)((long)args + 1));
      auVar9[2] = -(*(char *)((long)defargs + 2) == *(char *)((long)args + 2));
      auVar9[3] = -(*(char *)((long)defargs + 3) == *(char *)((long)args + 3));
      auVar9[4] = -((char)defargs[1] == (char)args[1]);
      auVar9[5] = -(*(char *)((long)defargs + 5) == *(char *)((long)args + 5));
      auVar9[6] = -(*(char *)((long)defargs + 6) == *(char *)((long)args + 6));
      auVar9[7] = -(*(char *)((long)defargs + 7) == *(char *)((long)args + 7));
      auVar9[8] = -((char)defargs[2] == (char)args[2]);
      auVar9[9] = -(*(char *)((long)defargs + 9) == *(char *)((long)args + 9));
      auVar9[10] = -(*(char *)((long)defargs + 10) == *(char *)((long)args + 10));
      auVar9[0xb] = -(*(char *)((long)defargs + 0xb) == *(char *)((long)args + 0xb));
      auVar9[0xc] = -((char)defargs[3] == (char)args[3]);
      auVar9[0xd] = -(*(char *)((long)defargs + 0xd) == *(char *)((long)args + 0xd));
      auVar9[0xe] = -(*(char *)((long)defargs + 0xe) == *(char *)((long)args + 0xe));
      auVar9[0xf] = -(*(char *)((long)defargs + 0xf) == *(char *)((long)args + 0xf));
      iVar5 = args[4];
      iVar3 = defargs[4];
      auVar10[0] = -((char)iVar3 == (char)iVar5);
      auVar10[1] = -((char)((uint)iVar3 >> 8) == (char)((uint)iVar5 >> 8));
      auVar10[2] = -((char)((uint)iVar3 >> 0x10) == (char)((uint)iVar5 >> 0x10));
      auVar10[3] = -((char)((uint)iVar3 >> 0x18) == (char)((uint)iVar5 >> 0x18));
      auVar10[4] = 0xff;
      auVar10[5] = 0xff;
      auVar10[6] = 0xff;
      auVar10[7] = 0xff;
      auVar10[8] = 0xff;
      auVar10[9] = 0xff;
      auVar10[10] = 0xff;
      auVar10[0xb] = 0xff;
      auVar10[0xc] = 0xff;
      auVar10[0xd] = 0xff;
      auVar10[0xe] = 0xff;
      auVar10[0xf] = 0xff;
      auVar10 = auVar10 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        return this;
      }
    }
    WriteKey(this,key);
    FWriter::StartArray(this->w);
    lVar7 = 0;
    do {
      if (((lVar7 == 0) && (*args < 0)) && ((special - 0x50U < 6 || (special == 0xe2)))) {
        FWriter::String(this->w,FName::NameData.NameArray[(uint)-*args].Text);
      }
      else {
        FWriter::Int(this->w,args[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    FWriter::EndArray(this->w);
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Args(const char *key, int *args, int *defargs, int special)
{
	if (isWriting())
	{
		if (w->inObject() && defargs != nullptr && !memcmp(args, defargs, 5 * sizeof(int)))
		{
			return *this;
		}

		WriteKey(key);
		w->StartArray();
		for (int i = 0; i < 5; i++)
		{
			if (i == 0 && args[i] < 0 && P_IsACSSpecial(special))
			{
				w->String(FName(ENamedName(-args[i])).GetChars());
			}
			else
			{
				w->Int(args[i]);
			}
		}
		w->EndArray();
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				unsigned int cnt = MIN<unsigned>(val->Size(), 5);
				for (unsigned int i = 0; i < cnt; i++)
				{
					const rapidjson::Value &aval = (*val)[i];
					if (aval.IsInt())
					{
						args[i] = aval.GetInt();
					}
					else if (i == 0 && aval.IsString())
					{
						args[i] = -FName(UnicodeToString(aval.GetString()));
					}
					else
					{
						assert(false && "Integer expected");
						Printf(TEXTCOLOR_RED "Integer expected for '%s[%d]'", key, i);
						mErrors++;
					}
				}
			}
			else
			{
				assert(false && "array expected");
				Printf(TEXTCOLOR_RED "array expected for '%s'", key);
				mErrors++;
			}
		}
	}
	return *this;
}